

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O1

void TTD::RuntimeContextInfo::LoadAndOrderPropertyNames
               (RecyclableObject *obj,
               List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *propertyList)

{
  int iVar1;
  ScriptContext *this;
  Type pPVar2;
  Type pPVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  PropertyRecord *pPVar9;
  Type *ppPVar10;
  long lVar11;
  int iVar12;
  int requiredCapacity;
  int iVar13;
  int index;
  ulong uVar14;
  int local_40;
  
  if ((propertyList->
      super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>).count
      != 0) {
    TTDAbort_unrecoverable_error("This should be empty.");
  }
  this = (((((obj->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.
         ptr;
  uVar5 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
            [10])();
  if (uVar5 != 0) {
    uVar14 = 0;
    do {
      uVar6 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[7])(obj,uVar14 & 0xffff);
      if (uVar6 - 0x10 < 0xffffffef) {
        iVar7 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0xc])(obj,(ulong)uVar6);
        if (iVar7 == 0) {
          TTDAbort_unrecoverable_error("We are assuming this is own property count.");
        }
        pPVar9 = Js::ScriptContext::GetPropertyName(this,uVar6);
        JsUtil::
        List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(propertyList,0);
        iVar7 = (propertyList->
                super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
                ).count;
        (propertyList->
        super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>).
        buffer[iVar7] = pPVar9;
        (propertyList->
        super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>).
        count = iVar7 + 1;
      }
      uVar6 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar6;
    } while (uVar5 != uVar6);
  }
  iVar7 = (propertyList->
          super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>).
          count;
  lVar11 = 0;
  do {
    iVar1 = (&DAT_010f5190)[lVar11];
    if (iVar1 < iVar7) {
      local_40 = 0;
      index = iVar1;
      do {
        ppPVar10 = JsUtil::
                   List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   ::Item(propertyList,index);
        pPVar2 = *ppPVar10;
        iVar8 = index;
        if (iVar1 <= index) {
          iVar12 = local_40;
          iVar13 = index;
          do {
            ppPVar10 = JsUtil::
                       List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       ::Item(propertyList,iVar12);
            uVar5 = (*ppPVar10)->byteCount >> 1;
            uVar6 = pPVar2->byteCount >> 1;
            if (uVar5 == uVar6) {
              iVar8 = PAL_wcscmp((char16_t *)(*ppPVar10 + 1),(char16_t *)(pPVar2 + 1));
              bVar4 = 0 < iVar8;
            }
            else {
              bVar4 = uVar6 < uVar5;
            }
            iVar8 = iVar13;
            if (!bVar4) break;
            iVar8 = iVar13 - iVar1;
            ppPVar10 = JsUtil::
                       List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       ::Item(propertyList,iVar12);
            pPVar3 = *ppPVar10;
            requiredCapacity = iVar13 + 1;
            JsUtil::
            List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(propertyList,requiredCapacity);
            (propertyList->
            super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>).
            buffer[iVar13] = pPVar3;
            iVar13 = (propertyList->
                     super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
                     ).count;
            if (requiredCapacity < iVar13) {
              requiredCapacity = iVar13;
            }
            (propertyList->
            super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>).
            count = requiredCapacity;
            iVar12 = iVar12 - iVar1;
            iVar13 = iVar8;
          } while (iVar1 <= iVar8);
        }
        iVar12 = iVar8 + 1;
        JsUtil::
        List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        ::EnsureArray(propertyList,iVar12);
        (propertyList->
        super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>).
        buffer[iVar8] = pPVar2;
        iVar8 = (propertyList->
                super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
                ).count;
        if (iVar12 < iVar8) {
          iVar12 = iVar8;
        }
        (propertyList->
        super_ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>).
        count = iVar12;
        index = index + 1;
        local_40 = local_40 + 1;
      } while (index != iVar7);
    }
    lVar11 = lVar11 + 1;
    if (lVar11 == 6) {
      return;
    }
  } while( true );
}

Assistant:

void RuntimeContextInfo::LoadAndOrderPropertyNames(Js::RecyclableObject* obj, JsUtil::List<const Js::PropertyRecord*, HeapAllocator>& propertyList)
    {
        TTDAssert(propertyList.Count() == 0, "This should be empty.");

        Js::ScriptContext* ctx = obj->GetScriptContext();
        uint32 propcount = (uint32)obj->GetPropertyCount();

        //get all of the properties
        for(uint32 i = 0; i < propcount; ++i)
        {
            Js::PropertyIndex propertyIndex = (Js::PropertyIndex)i;
            Js::PropertyId propertyId = obj->GetPropertyId(propertyIndex);

            if((propertyId != Js::Constants::NoProperty) & (!Js::IsInternalPropertyId(propertyId)))
            {
                TTDAssert(obj->HasOwnProperty(propertyId), "We are assuming this is own property count.");

                propertyList.Add(ctx->GetPropertyName(propertyId));
            }
        }

        //now sort the list so the traversal order is stable
        //Rock a custom shell sort!!!!
        const int32 gaps[6] = { 132, 57, 23, 10, 4, 1 };

        int32 llen = propertyList.Count();
        for(uint32 gapi = 0; gapi < 6; ++gapi)
        {
            int32 gap = gaps[gapi];

            for(int32 i = gap; i < llen; i++)
            {
                const Js::PropertyRecord* temp = propertyList.Item(i);

                int32 j = 0;
                for(j = i; j >= gap && PropertyNameCmp(propertyList.Item(j - gap), temp); j -= gap)
                {
                    const Js::PropertyRecord* shiftElem = propertyList.Item(j - gap);
                    propertyList.SetItem(j, shiftElem);
                }

                propertyList.SetItem(j, temp);
            }
        }
    }